

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

data_node_type * __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
split_upwards(Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *this,double key,int stop_propagation_level,
             vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
             *traversal_path,bool reuse_model,model_node_type **new_parent,bool verbose)

{
  int *piVar1;
  longlong *plVar2;
  uint8_t *puVar3;
  undefined1 *puVar4;
  _func_int ***ppp_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint8_t uVar8;
  short sVar9;
  _func_int **pp_Var10;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true> *pAVar16
  ;
  pointer ppAVar17;
  pointer ppAVar18;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true> *this_00
  ;
  pointer ppAVar19;
  byte bVar20;
  byte bVar21;
  data_node_type *pdVar22;
  ostream *poVar23;
  data_node_type *pdVar24;
  self_type *psVar25;
  pointer pTVar26;
  long *plVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  data_node_type *pdVar32;
  byte bVar33;
  pointer pTVar34;
  int iVar35;
  long lVar36;
  uint uVar37;
  undefined7 in_register_00000089;
  int iVar38;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *pAVar39;
  byte bVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 in_XMM4_Qa;
  double dVar56;
  undefined8 in_XMM5_Qb;
  data_node_type *local_100;
  data_node_type *local_f0;
  short *local_e8;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *local_d8;
  data_node_type *local_d0;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *local_c8;
  ulong local_c0;
  model_node_type *local_b8;
  undefined4 local_ac;
  ulong local_a8;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *local_a0;
  vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  to_delete;
  ulong local_50;
  
  local_ac = (undefined4)CONCAT71(in_register_00000089,verbose);
  if (stop_propagation_level < this->root_node_->level_) {
    __assert_fail("stop_propagation_level >= root_node_->level_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x728,
                  "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar34 = (traversal_path->
            super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = pTVar34[-1].node;
  iVar38 = pTVar34[-1].bucketID;
  pAVar39 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
             *)local_b8->children_[iVar38];
  uVar37 = 1 << ((pAVar39->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
  local_c0 = (ulong)uVar37;
  piVar1 = &(this->stats_).num_sideways_splits;
  *piVar1 = *piVar1 + 1;
  iVar38 = iVar38 - iVar38 % (int)uVar37;
  dVar41 = (double)iVar38;
  iVar30 = iVar38 + uVar37;
  plVar2 = &(this->stats_).num_sideways_split_keys;
  *plVar2 = *plVar2 + (long)pAVar39->num_keys_;
  dVar11 = (double)(int)uVar37 * 0.5 + dVar41;
  dVar48 = (double)pAVar39->num_right_out_of_bounds_inserts_ / (double)pAVar39->num_inserts_;
  if (dVar48 <= 0.9) {
    bVar21 = 0;
LAB_0010fb7b:
    bVar20 = 0;
  }
  else {
    auVar53._8_8_ = 0;
    auVar53._0_8_ = pAVar39->max_key_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (local_b8->super_AlexNode<double,_double>).model_.a_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (local_b8->super_AlexNode<double,_double>).model_.b_;
    auVar6 = vfmadd213sd_fma(auVar50,auVar53,auVar6);
    if ((auVar6._0_8_ < dVar41) || (dVar11 <= auVar6._0_8_)) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar11;
      uVar12 = vcmppd_avx512vl(auVar6,auVar14,0xd);
      auVar54._0_8_ = (double)iVar30;
      auVar54._8_8_ = in_XMM4_Qa;
      uVar13 = vcmppd_avx512vl(auVar6,auVar54,1);
      bVar21 = (byte)uVar12 & 3 & (byte)uVar13;
      goto LAB_0010fb7b;
    }
    bVar21 = 0;
    bVar20 = 1;
  }
  local_a8 = CONCAT44(local_a8._4_4_,iVar30);
  dVar56 = (double)pAVar39->num_left_out_of_bounds_inserts_ / (double)pAVar39->num_inserts_;
  if (dVar56 <= 0.9) {
    dVar45 = (local_b8->super_AlexNode<double,_double>).model_.a_;
    dVar49 = (local_b8->super_AlexNode<double,_double>).model_.b_;
    bVar40 = 0;
LAB_0010fc11:
    bVar33 = 0;
  }
  else {
    dVar45 = (local_b8->super_AlexNode<double,_double>).model_.a_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar45;
    dVar49 = (local_b8->super_AlexNode<double,_double>).model_.b_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar49;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = pAVar39->min_key_;
    auVar6 = vfmadd213sd_fma(auVar55,auVar46,auVar51);
    if ((auVar6._0_8_ < dVar41) || (dVar11 <= auVar6._0_8_)) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar11;
      uVar12 = vcmppd_avx512vl(auVar6,auVar15,0xd);
      auVar42._0_8_ = (double)iVar30;
      auVar42._8_8_ = in_XMM5_Qb;
      uVar13 = vcmppd_avx512vl(auVar6,auVar42,1);
      bVar40 = (byte)uVar12 & 3 & (byte)uVar13;
      goto LAB_0010fc11;
    }
    bVar40 = 0;
    bVar33 = 1;
  }
  local_d8 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *)((dVar11 - dVar49) / dVar45);
  local_c8 = this;
  local_a0 = traversal_path;
  iVar30 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           ::lower_bound<double>(pAVar39,(double *)&local_d8);
  pAVar16 = local_c8;
  pdVar22 = bulk_load_leaf_node_from_existing
                      (local_c8,pAVar39,0,iVar30,true,(FTNode *)0x0,reuse_model,
                       (bool)(0.9 < dVar48 & bVar20),(bool)(0.9 < dVar56 & bVar33));
  local_d0 = bulk_load_leaf_node_from_existing
                       (pAVar16,pAVar39,iVar30,pAVar39->data_capacity_,true,(FTNode *)0x0,
                        reuse_model,(bool)(0.9 < dVar48 & bVar21),(bool)(0.9 < dVar56 & bVar40));
  uVar8 = (pAVar39->super_AlexNode<double,_double>).duplication_factor_;
  (pdVar22->super_AlexNode<double,_double>).duplication_factor_ = uVar8;
  (local_d0->super_AlexNode<double,_double>).duplication_factor_ = uVar8;
  sVar9 = (pAVar39->super_AlexNode<double,_double>).level_;
  (pdVar22->super_AlexNode<double,_double>).level_ = sVar9;
  (local_d0->super_AlexNode<double,_double>).level_ = sVar9;
  psVar25 = pAVar39->prev_leaf_;
  if (psVar25 != (self_type *)0x0) {
    psVar25->next_leaf_ = pdVar22;
  }
  pdVar22->prev_leaf_ = psVar25;
  pdVar22->next_leaf_ = local_d0;
  local_d0->prev_leaf_ = pdVar22;
  psVar25 = pAVar39->next_leaf_;
  local_d0->next_leaf_ = psVar25;
  if (psVar25 != (self_type *)0x0) {
    psVar25->prev_leaf_ = local_d0;
  }
  local_d8 = pAVar39;
  if (to_delete.
      super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      to_delete.
      super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>::
    _M_realloc_insert<alex::AlexNode<double,double>*>
              ((vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>
                *)&to_delete,
               (iterator)
               to_delete.
               super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(AlexNode<double,_double> **)&local_d8);
  }
  else {
    *to_delete.
     super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = (AlexNode<double,_double> *)pAVar39;
    to_delete.
    super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         to_delete.
         super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  piVar1 = &(local_c8->stats_).num_data_nodes;
  *piVar1 = *piVar1 + -1;
  if ((char)local_ac != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Splitting upwards data node] level ",0x24);
    poVar23 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cout,(pAVar39->super_AlexNode<double,_double>).level_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", node addr: ",0xd);
    poVar23 = std::ostream::_M_insert<void_const*>(poVar23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", node repeats in parent: ",0x1a);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", node indexes in parent: [",0x1b);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", left leaf indexes: [0, ",0x19);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", right leaf indexes: [",0x17);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", ",2);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,pAVar39->data_capacity_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", new nodes addr: ",0x12);
    poVar23 = std::ostream::_M_insert<void_const*>(poVar23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,",",1);
    poVar23 = std::ostream::_M_insert<void_const*>(poVar23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
    std::ostream::put((char)poVar23);
    std::ostream::flush();
  }
  dVar41 = (local_b8->super_AlexNode<double,_double>).model_.a_;
  dVar48 = (local_b8->super_AlexNode<double,_double>).model_.b_;
  pTVar26 = (local_a0->
            super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar28 = (long)(local_a0->
                 super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar26;
  local_a8 = uVar28 >> 4;
  local_50 = (long)(uVar28 * 0x10000000 + -0x100000000) >> 0x20;
  pAVar39 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
             *)pTVar26[local_50].node;
  pTVar34 = pTVar26 + local_50;
  iVar38 = (int)(pAVar39->super_AlexNode<double,_double>).level_;
  if (stop_propagation_level < iVar38) {
    puVar4 = &local_c8->field_0xc9;
    local_f0 = local_d0;
    pdVar32 = pdVar22;
    do {
      local_e8 = &(pAVar39->super_AlexNode<double,_double>).level_;
      piVar1 = &(local_c8->stats_).num_model_node_splits;
      *piVar1 = *piVar1 + 1;
      iVar38 = *(int *)&pAVar39->allocator_;
      plVar2 = &(local_c8->stats_).num_model_node_split_pointers;
      *plVar2 = *plVar2 + (long)iVar38;
      iVar30 = pTVar34->bucketID;
      iVar38 = iVar38 / 2;
      if (iVar30 < iVar38) {
        if (1 << (*(byte *)((long)(&(pAVar39->next_leaf_->super_AlexNode<double,_double>).
                                    _vptr_AlexNode)[iVar38] + 9) & 0x1f) == iVar38) {
          local_100 = (data_node_type *)operator_new(0x40);
          pdVar24 = (data_node_type *)0x0;
          sVar9 = *local_e8;
          (local_100->super_AlexNode<double,_double>).is_leaf_ = false;
          (local_100->super_AlexNode<double,_double>).duplication_factor_ = '\0';
          (local_100->super_AlexNode<double,_double>).level_ = sVar9;
          local_c0 = CONCAT71((uint7)(byte)((ushort)sVar9 >> 8),1);
          (local_100->super_AlexNode<double,_double>).model_.a_ = 0.0;
          (local_100->super_AlexNode<double,_double>).model_.b_ = 0.0;
          (local_100->super_AlexNode<double,_double>).cost_ = 0.0;
          (local_100->super_AlexNode<double,_double>)._vptr_AlexNode =
               (_func_int **)&PTR__AlexModelNode_0011acc8;
          local_100->key_less_ = (AlexCompare *)puVar4;
          *(undefined4 *)&local_100->allocator_ = 0;
          local_100->next_leaf_ = (self_type *)0x0;
        }
        else {
LAB_0011011f:
          local_100 = (data_node_type *)operator_new(0x40);
          sVar9 = *local_e8;
          (local_100->super_AlexNode<double,_double>).is_leaf_ = false;
          (local_100->super_AlexNode<double,_double>).duplication_factor_ = '\0';
          (local_100->super_AlexNode<double,_double>).level_ = sVar9;
          (local_100->super_AlexNode<double,_double>).model_.a_ = 0.0;
          (local_100->super_AlexNode<double,_double>).model_.b_ = 0.0;
          (local_100->super_AlexNode<double,_double>).cost_ = 0.0;
          (local_100->super_AlexNode<double,_double>)._vptr_AlexNode =
               (_func_int **)&PTR__AlexModelNode_0011acc8;
          local_100->key_less_ = (AlexCompare *)puVar4;
          *(undefined4 *)&local_100->allocator_ = 0;
          local_100->next_leaf_ = (self_type *)0x0;
          pdVar24 = (data_node_type *)operator_new(0x40);
          sVar9 = *local_e8;
          (pdVar24->super_AlexNode<double,_double>).is_leaf_ = false;
          (pdVar24->super_AlexNode<double,_double>).duplication_factor_ = '\0';
          local_c0 = 0;
          local_b8 = (model_node_type *)0x0;
          (pdVar24->super_AlexNode<double,_double>).level_ = sVar9;
          (pdVar24->super_AlexNode<double,_double>).model_.a_ = 0.0;
          (pdVar24->super_AlexNode<double,_double>).model_.b_ = 0.0;
          (pdVar24->super_AlexNode<double,_double>).cost_ = 0.0;
          (pdVar24->super_AlexNode<double,_double>)._vptr_AlexNode =
               (_func_int **)&PTR__AlexModelNode_0011acc8;
          pdVar24->key_less_ = (AlexCompare *)puVar4;
          *(undefined4 *)&pdVar24->allocator_ = 0;
          pdVar24->next_leaf_ = (self_type *)0x0;
          if (iVar38 <= iVar30) goto LAB_001102cf;
        }
        if ((int)local_a8 ==
            (int)((ulong)((long)(local_a0->
                                super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_a0->
                               super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          *new_parent = (model_node_type *)local_100;
        }
        iVar38 = *(int *)&pAVar39->allocator_;
        *(int *)&local_100->allocator_ = iVar38;
        psVar25 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                            ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_d8,
                             (long)iVar38,(void *)0x0);
        local_100->next_leaf_ = psVar25;
        iVar30 = 0;
        dVar56 = (pAVar39->super_AlexNode<double,_double>).model_.a_;
        dVar45 = (pAVar39->super_AlexNode<double,_double>).model_.b_;
        (local_100->super_AlexNode<double,_double>).model_.a_ = dVar56 + dVar56;
        (local_100->super_AlexNode<double,_double>).model_.b_ = dVar45 + dVar45;
        iVar38 = *(int *)&pAVar39->allocator_ / 2;
        if (1 < *(int *)&pAVar39->allocator_) {
          iVar30 = 0;
          do {
            pp_Var10 = (&(pAVar39->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)
                       [iVar30];
            bVar21 = *(byte *)((long)pp_Var10 + 9);
            if (bVar21 != 0x1f) {
              lVar36 = (long)(iVar30 * 2);
              do {
                (&(local_100->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar36] =
                     pp_Var10;
                lVar36 = lVar36 + 1;
              } while ((2 << (bVar21 & 0x1f)) + iVar30 * 2 != lVar36);
            }
            iVar30 = iVar30 + (1 << (bVar21 & 0x1f));
            *(byte *)((long)pp_Var10 + 9) = bVar21 + 1;
          } while (iVar30 < iVar38);
        }
        if (iVar30 != iVar38) {
          __assert_fail("cur == cur_node->num_children_ / 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                        ,0x7c6,
                        "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                       );
        }
        if ((char)local_c0 == '\0') {
          *(int *)&pdVar24->allocator_ = iVar38;
          psVar25 = (self_type *)
                    __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                              ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_d8,
                               (long)iVar38,(void *)0x0);
          pdVar24->next_leaf_ = psVar25;
          (pdVar24->super_AlexNode<double,_double>).model_.a_ =
               (pAVar39->super_AlexNode<double,_double>).model_.a_;
          iVar38 = *(int *)&pAVar39->allocator_;
          (pdVar24->super_AlexNode<double,_double>).model_.b_ =
               (pAVar39->super_AlexNode<double,_double>).model_.b_ - (double)(iVar38 / 2);
          if (0 < (long)iVar38) {
            uVar28 = (ulong)(uint)(iVar38 / 2);
            lVar36 = 0;
            do {
              ppp_Var5 = &(pAVar39->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode +
                         uVar28;
              uVar28 = uVar28 + 1;
              *(_func_int ***)
               ((long)&(pdVar24->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode + lVar36
               ) = *ppp_Var5;
              lVar36 = lVar36 + 8;
            } while (uVar28 < (ulong)(long)iVar38);
          }
        }
        else {
          pdVar24 = (data_node_type *)
                    (&(pAVar39->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[iVar38];
          (pdVar24->super_AlexNode<double,_double>).level_ = *local_e8;
        }
        iVar30 = pTVar34->bucketID * 2;
        iVar35 = 2 << ((pdVar32->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
        iVar30 = iVar30 - iVar30 % iVar35;
        iVar38 = (iVar35 >> 1) + iVar30;
        if (0 < iVar35 >> 1) {
          lVar36 = (long)iVar30;
          do {
            (&(local_100->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar36] =
                 (_func_int **)pdVar32;
            lVar36 = lVar36 + 1;
          } while (lVar36 < iVar38);
        }
        if (0 < iVar35) {
          lVar36 = (long)iVar38;
          do {
            (&(local_100->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar36] =
                 (_func_int **)local_f0;
            lVar36 = lVar36 + 1;
          } while (lVar36 < iVar30 + iVar35);
        }
        local_b8 = (model_node_type *)0x0;
      }
      else {
        if (1 << (*(byte *)((long)(pAVar39->next_leaf_->super_AlexNode<double,_double>).
                                  _vptr_AlexNode + 9) & 0x1f) != iVar38) goto LAB_0011011f;
        pdVar24 = (data_node_type *)operator_new(0x40);
        local_100 = (data_node_type *)0x0;
        sVar9 = *local_e8;
        (pdVar24->super_AlexNode<double,_double>).is_leaf_ = false;
        (pdVar24->super_AlexNode<double,_double>).duplication_factor_ = '\0';
        (pdVar24->super_AlexNode<double,_double>).level_ = sVar9;
        local_b8 = (model_node_type *)CONCAT71((uint7)(byte)((ushort)sVar9 >> 8),1);
        (pdVar24->super_AlexNode<double,_double>).model_.a_ = 0.0;
        (pdVar24->super_AlexNode<double,_double>).model_.b_ = 0.0;
        (pdVar24->super_AlexNode<double,_double>).cost_ = 0.0;
        (pdVar24->super_AlexNode<double,_double>)._vptr_AlexNode =
             (_func_int **)&PTR__AlexModelNode_0011acc8;
        pdVar24->key_less_ = (AlexCompare *)puVar4;
        *(undefined4 *)&pdVar24->allocator_ = 0;
        pdVar24->next_leaf_ = (self_type *)0x0;
LAB_001102cf:
        if ((int)local_a8 ==
            (int)((ulong)((long)(local_a0->
                                super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_a0->
                               super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          *new_parent = (model_node_type *)pdVar24;
        }
        if ((char)local_b8 == '\0') {
          iVar38 = *(int *)&pAVar39->allocator_ / 2;
          *(int *)&local_100->allocator_ = iVar38;
          psVar25 = (self_type *)
                    __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                              ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_d8,
                               (long)iVar38,(void *)0x0);
          local_100->next_leaf_ = psVar25;
          dVar56 = (pAVar39->super_AlexNode<double,_double>).model_.b_;
          (local_100->super_AlexNode<double,_double>).model_.a_ =
               (pAVar39->super_AlexNode<double,_double>).model_.a_;
          (local_100->super_AlexNode<double,_double>).model_.b_ = dVar56;
          uVar37 = *(uint *)&pAVar39->allocator_;
          if (1 < (int)uVar37) {
            uVar28 = 0;
            do {
              (&(local_100->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[uVar28] =
                   (&(pAVar39->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar37 >> 1 != uVar28);
          }
        }
        else {
          local_100 = (data_node_type *)
                      (pAVar39->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode;
          (local_100->super_AlexNode<double,_double>).level_ = *local_e8;
          uVar37 = *(uint *)&pAVar39->allocator_;
        }
        *(uint *)&pdVar24->allocator_ = uVar37;
        psVar25 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                            ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_d8,
                             (long)(int)uVar37,(void *)0x0);
        pdVar24->next_leaf_ = psVar25;
        uVar37 = *(uint *)&pAVar39->allocator_;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = (pAVar39->super_AlexNode<double,_double>).model_.a_;
        uVar31 = (int)uVar37 / 2;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = (pAVar39->super_AlexNode<double,_double>).model_.b_ - (double)(int)uVar31;
        auVar6 = vunpcklpd_avx(auVar52,auVar43);
        (pdVar24->super_AlexNode<double,_double>).model_.a_ = auVar6._0_8_ + auVar6._0_8_;
        (pdVar24->super_AlexNode<double,_double>).model_.b_ = auVar6._8_8_ + auVar6._8_8_;
        if (0 < (int)uVar37) {
          do {
            pp_Var10 = (&(pAVar39->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)
                       [(int)uVar31];
            bVar21 = *(byte *)((long)pp_Var10 + 9);
            if (bVar21 != 0x1f) {
              lVar36 = (long)(int)((uVar31 - (uVar37 >> 1)) * 2);
              do {
                (&(pdVar24->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar36] =
                     pp_Var10;
                lVar36 = lVar36 + 1;
              } while ((int)((2 << (bVar21 & 0x1f)) + (uVar31 * 2 - (uVar37 & 0x7ffffffe))) !=
                       lVar36);
            }
            uVar31 = uVar31 + (1 << (bVar21 & 0x1f));
            *(byte *)((long)pp_Var10 + 9) = bVar21 + 1;
          } while ((int)uVar31 < (int)uVar37);
        }
        if (uVar31 != uVar37) {
          __assert_fail("cur == cur_node->num_children_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                        ,0x816,
                        "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                       );
        }
        iVar30 = (pTVar34->bucketID - (uVar37 - ((int)uVar37 >> 0x1f) >> 1)) * 2;
        iVar35 = 2 << ((pdVar32->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
        iVar30 = iVar30 - iVar30 % iVar35;
        iVar38 = (iVar35 >> 1) + iVar30;
        if (0 < iVar35 >> 1) {
          lVar36 = (long)iVar30;
          do {
            (&(pdVar24->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar36] =
                 (_func_int **)pdVar32;
            lVar36 = lVar36 + 1;
          } while (lVar36 < iVar38);
        }
        if (0 < iVar35) {
          lVar36 = (long)iVar38;
          do {
            (&(pdVar24->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar36] =
                 (_func_int **)local_f0;
            lVar36 = lVar36 + 1;
          } while (lVar36 < iVar30 + iVar35);
        }
        local_c0 = 0;
      }
      if ((pdVar24 == (data_node_type *)0x0) || (local_100 == (data_node_type *)0x0)) {
        __assert_fail("next_left_split != nullptr && next_right_split != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x829,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      if ((char)local_ac != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[Splitting upwards through-node] level ",0x27);
        poVar23 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", node addr: ",0xd);
        poVar23 = std::ostream::_M_insert<void_const*>(poVar23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", node children: ",0x11);
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,pTVar34->node->num_children_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", child index: ",0xf);
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,pTVar34->bucketID);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", child repeats in node: ",0x19)
        ;
        poVar23 = (ostream *)
                  std::ostream::operator<<
                            (poVar23,1 << ((pdVar32->super_AlexNode<double,_double>).
                                           duplication_factor_ & 0x1f));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar23,", node repeats in parent: ",0x1a);
        poVar23 = (ostream *)
                  std::ostream::operator<<
                            (poVar23,1 << ((pTVar34->node->super_AlexNode<double,_double>).
                                           duplication_factor_ & 0x1f));
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,", new nodes addr: ",0x12);
        poVar23 = std::ostream::_M_insert<void_const*>(poVar23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,",",1);
        poVar23 = std::ostream::_M_insert<void_const*>(poVar23);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
        std::ostream::put((char)poVar23);
        std::ostream::flush();
      }
      local_d8 = pAVar39;
      if (to_delete.
          super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          to_delete.
          super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>::
        _M_realloc_insert<alex::AlexNode<double,double>*>
                  ((vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>
                    *)&to_delete,
                   (iterator)
                   to_delete.
                   super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(AlexNode<double,_double> **)&local_d8
                  );
      }
      else {
        *to_delete.
         super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &pAVar39->super_AlexNode<double,_double>;
        to_delete.
        super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             to_delete.
             super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if ((char)local_b8 == '\0' && (char)local_c0 == '\0') {
        piVar1 = &(local_c8->stats_).num_model_nodes;
        *piVar1 = *piVar1 + 1;
      }
      uVar8 = (pAVar39->super_AlexNode<double,_double>).duplication_factor_;
      (local_100->super_AlexNode<double,_double>).duplication_factor_ = uVar8;
      (pdVar24->super_AlexNode<double,_double>).duplication_factor_ = uVar8;
      uVar28 = local_50 - 1;
      local_a8 = local_50;
      pTVar26 = (local_a0->
                super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pAVar39 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                 *)pTVar26[uVar28].node;
      pTVar34 = pTVar26 + uVar28;
      iVar38 = (int)(pAVar39->super_AlexNode<double,_double>).level_;
      pdVar32 = local_100;
      local_f0 = pdVar24;
      local_50 = uVar28;
    } while (stop_propagation_level < iVar38);
  }
  else {
    local_f0 = local_d0;
    local_100 = pdVar22;
  }
  if (iVar38 != stop_propagation_level) {
    __assert_fail("top_node->level_ == stop_propagation_level",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x846,
                  "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  if ((int)local_a8 ==
      (int)((ulong)((long)(local_a0->
                          super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar26) >> 4)) {
    *new_parent = (model_node_type *)pAVar39;
  }
  bVar21 = (local_100->super_AlexNode<double,_double>).duplication_factor_;
  iVar38 = pTVar34->bucketID;
  iVar30 = 1 << (bVar21 & 0x1f);
  if ((char)local_ac != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Splitting upwards top node] level ",0x23);
    poVar23 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,stop_propagation_level);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", node addr: ",0xd);
    poVar23 = std::ostream::_M_insert<void_const*>(poVar23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", node children: ",0x11);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,*(int *)&pAVar39->allocator_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", child index: ",0xf);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", child repeats in node: ",0x19);
    poVar23 = (ostream *)std::ostream::operator<<(poVar23,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,", node repeats in parent: ",0x1a);
    plVar27 = (long *)std::ostream::operator<<
                                (poVar23,1 << ((pAVar39->super_AlexNode<double,_double>).
                                               duplication_factor_ & 0x1f));
    std::ios::widen((char)*(undefined8 *)(*plVar27 + -0x18) + (char)plVar27);
    std::ostream::put((char)plVar27);
    std::ostream::flush();
  }
  if (bVar21 == 0) {
    piVar1 = &(local_c8->stats_).num_model_node_expansions;
    *piVar1 = *piVar1 + 1;
    plVar2 = &(local_c8->stats_).num_model_node_expansion_pointers;
    *plVar2 = *plVar2 + (long)*(int *)&pAVar39->allocator_;
    AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::expand
              ((AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)pAVar39
               ,1);
    iVar35 = iVar38 * 2;
    iVar30 = iVar38 * 2 + 1;
    iVar38 = iVar38 * 2 + 2;
  }
  else {
    puVar3 = &(local_100->super_AlexNode<double,_double>).duplication_factor_;
    *puVar3 = *puVar3 + 0xff;
    puVar3 = &(local_f0->super_AlexNode<double,_double>).duplication_factor_;
    *puVar3 = *puVar3 + 0xff;
    pdVar32 = local_d0;
    pAVar16 = local_c8;
    ppAVar17 = to_delete.
               super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppAVar18 = to_delete.
               super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar30 < 2) goto joined_r0x001109b8;
    iVar35 = iVar38 - iVar38 % iVar30;
    iVar38 = iVar30 + iVar35;
    iVar30 = iVar30 / 2 + iVar35;
  }
  lVar29 = (long)iVar35;
  lVar36 = (long)iVar30;
  do {
    (&(pAVar39->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar29] =
         (_func_int **)local_100;
    lVar29 = lVar29 + 1;
  } while (lVar29 < lVar36);
  do {
    (&(pAVar39->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar36] =
         (_func_int **)local_f0;
    lVar36 = lVar36 + 1;
    pdVar32 = local_d0;
    pAVar16 = local_c8;
    ppAVar17 = to_delete.
               super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppAVar18 = to_delete.
               super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  } while (lVar36 < iVar38);
joined_r0x001109b8:
  for (; ppAVar19 = to_delete.
                    super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish, this_00 = local_c8,
      pdVar24 = local_d0, local_d0 = pdVar32, local_c8 = pAVar16,
      ppAVar17 !=
      to_delete.
      super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppAVar17 = ppAVar17 + 1) {
    to_delete.
    super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppAVar18;
    delete_node(this_00,*ppAVar17);
    pdVar32 = local_d0;
    pAVar16 = local_c8;
    ppAVar18 = to_delete.
               super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    to_delete.
    super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppAVar19;
    local_c8 = this_00;
    local_d0 = pdVar24;
  }
  if (to_delete.
      super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    to_delete.
    super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppAVar18;
    operator_delete(to_delete.
                    super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)to_delete.
                          super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)to_delete.
                          super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  auVar44._8_8_ = 0;
  auVar44._0_8_ = key;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar48;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar41;
  auVar6 = vfmadd132sd_fma(auVar44,auVar47,auVar7);
  if (auVar6._0_8_ < dVar11) {
    pdVar24 = pdVar22;
  }
  return pdVar24;
}

Assistant:

data_node_type* split_upwards(
      T key, int stop_propagation_level,
      const std::vector<TraversalNode>& traversal_path, bool reuse_model,
      model_node_type** new_parent, bool verbose = false) {
    assert(stop_propagation_level >= root_node_->level_);
    std::vector<AlexNode<T, P>*> to_delete;  // nodes that need to be deleted

    // Split the data node into two new data nodes
    const TraversalNode& parent_path_node = traversal_path.back();
    model_node_type* parent = parent_path_node.node;
    auto leaf = static_cast<data_node_type*>(
        parent->children_[parent_path_node.bucketID]);
    int leaf_repeats = 1 << (leaf->duplication_factor_);
    int leaf_start_bucketID =
        parent_path_node.bucketID - (parent_path_node.bucketID % leaf_repeats);
    double leaf_mid_bucketID = leaf_start_bucketID + leaf_repeats / 2.0;
    int leaf_end_bucketID =
        leaf_start_bucketID + leaf_repeats;  // first bucket with next child
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    // Determine if either of the two new data nodes will need to adapt to
    // append-mostly behavior
    bool append_mostly_right = leaf->is_append_mostly_right();
    bool left_half_appending_right = false, right_half_appending_right = false;
    if (append_mostly_right) {
      double appending_right_bucketID =
          parent->model_.predict_double(leaf->max_key_);
      if (appending_right_bucketID >= leaf_start_bucketID &&
          appending_right_bucketID < leaf_mid_bucketID) {
        left_half_appending_right = true;
      } else if (appending_right_bucketID >= leaf_mid_bucketID &&
                 appending_right_bucketID < leaf_end_bucketID) {
        right_half_appending_right = true;
      }
    }
    bool append_mostly_left = leaf->is_append_mostly_left();
    bool left_half_appending_left = false, right_half_appending_left = false;
    if (append_mostly_left) {
      double appending_left_bucketID =
          parent->model_.predict_double(leaf->min_key_);
      if (appending_left_bucketID >= leaf_start_bucketID &&
          appending_left_bucketID < leaf_mid_bucketID) {
        left_half_appending_left = true;
      } else if (appending_left_bucketID >= leaf_mid_bucketID &&
                 appending_left_bucketID < leaf_end_bucketID) {
        right_half_appending_left = true;
      }
    }

    int mid_boundary = leaf->lower_bound(
        (leaf_mid_bucketID - parent->model_.b_) / parent->model_.a_);
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        leaf, 0, mid_boundary, true, nullptr, reuse_model,
        append_mostly_right && left_half_appending_right,
        append_mostly_left && left_half_appending_left);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        leaf, mid_boundary, leaf->data_capacity_, true, nullptr, reuse_model,
        append_mostly_right && right_half_appending_right,
        append_mostly_left && right_half_appending_left);
    // This is the expected duplication factor; it will be correct once we
    // split/expand the parent
    left_leaf->duplication_factor_ = leaf->duplication_factor_;
    right_leaf->duplication_factor_ = leaf->duplication_factor_;
    left_leaf->level_ = leaf->level_;
    right_leaf->level_ = leaf->level_;
    link_data_nodes(leaf, left_leaf, right_leaf);
    to_delete.push_back(leaf);
    stats_.num_data_nodes--;

    if (verbose) {
      std::cout << "[Splitting upwards data node] level " << leaf->level_
                << ", node addr: " << leaf
                << ", node repeats in parent: " << leaf_repeats
                << ", node indexes in parent: [" << leaf_start_bucketID << ", "
                << leaf_end_bucketID << ")"
                << ", left leaf indexes: [0, " << mid_boundary << ")"
                << ", right leaf indexes: [" << mid_boundary << ", "
                << leaf->data_capacity_ << ")"
                << ", new nodes addr: " << left_leaf << "," << right_leaf
                << std::endl;
    }

    // The new data node that the key falls into is the one we return
    data_node_type* new_data_node;
    if (parent->model_.predict_double(key) < leaf_mid_bucketID) {
      new_data_node = left_leaf;
    } else {
      new_data_node = right_leaf;
    }

    // Split all internal nodes from the parent up to the highest node along the
    // traversal path.
    // As this happens, the entries of the traversal path will go stale, which
    // is fine because we no longer use them.
    // Splitting an internal node involves dividing the child pointers into two
    // halves, and doubling the relevant half.
    AlexNode<T, P>* prev_left_split = left_leaf;
    AlexNode<T, P>* prev_right_split = right_leaf;
    int path_idx = static_cast<int>(traversal_path.size()) - 1;
    while (traversal_path[path_idx].node->level_ > stop_propagation_level) {
      // Decide which half to double
      const TraversalNode& path_node = traversal_path[path_idx];
      model_node_type* cur_node = path_node.node;
      stats_.num_model_node_splits++;
      stats_.num_model_node_split_pointers += cur_node->num_children_;
      bool double_left_half = path_node.bucketID < cur_node->num_children_ / 2;
      model_node_type* left_split = nullptr;
      model_node_type* right_split = nullptr;

      // If one of the resulting halves will only have one child pointer, we
      // should "pull up" that child
      bool pull_up_left_child = false, pull_up_right_child = false;
      AlexNode<T, P>* left_half_first_child = cur_node->children_[0];
      AlexNode<T, P>* right_half_first_child =
          cur_node->children_[cur_node->num_children_ / 2];
      if (double_left_half &&
          (1 << right_half_first_child->duplication_factor_) ==
              cur_node->num_children_ / 2) {
        // pull up right child if all children in the right half are the same
        pull_up_right_child = true;
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else if (!double_left_half &&
                 (1 << left_half_first_child->duplication_factor_) ==
                     cur_node->num_children_ / 2) {
        // pull up left child if all children in the left half are the same
        pull_up_left_child = true;
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else {
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      }

      // Do the split
      AlexNode<T, P>* next_left_split = nullptr;
      AlexNode<T, P>* next_right_split = nullptr;
      if (double_left_half) {
        // double left half
        assert(left_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = left_split;
        }
        left_split->num_children_ = cur_node->num_children_;
        left_split->children_ =
            new (pointer_allocator().allocate(left_split->num_children_))
                AlexNode<T, P>*[left_split->num_children_];
        left_split->model_.a_ = cur_node->model_.a_ * 2;
        left_split->model_.b_ = cur_node->model_.b_ * 2;
        int cur = 0;
        while (cur < cur_node->num_children_ / 2) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          for (int i = 2 * cur; i < 2 * (cur + cur_child_repeats); i++) {
            left_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_ / 2);

        if (pull_up_right_child) {
          next_right_split = cur_node->children_[cur_node->num_children_ / 2];
          next_right_split->level_ = cur_node->level_;
        } else {
          right_split->num_children_ = cur_node->num_children_ / 2;
          right_split->children_ =
              new (pointer_allocator().allocate(right_split->num_children_))
                  AlexNode<T, P>*[right_split->num_children_];
          right_split->model_.a_ = cur_node->model_.a_;
          right_split->model_.b_ =
              cur_node->model_.b_ - cur_node->num_children_ / 2;
          int j = 0;
          for (int i = cur_node->num_children_ / 2; i < cur_node->num_children_;
               i++) {
            right_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_right_split = right_split;
        }

        int new_bucketID = path_node.bucketID * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          left_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          left_split->children_[i] = prev_right_split;
        }
        next_left_split = left_split;
      } else {
        // double right half
        assert(right_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = right_split;
        }
        if (pull_up_left_child) {
          next_left_split = cur_node->children_[0];
          next_left_split->level_ = cur_node->level_;
        } else {
          left_split->num_children_ = cur_node->num_children_ / 2;
          left_split->children_ =
              new (pointer_allocator().allocate(left_split->num_children_))
                  AlexNode<T, P>*[left_split->num_children_];
          left_split->model_.a_ = cur_node->model_.a_;
          left_split->model_.b_ = cur_node->model_.b_;
          int j = 0;
          for (int i = 0; i < cur_node->num_children_ / 2; i++) {
            left_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_left_split = left_split;
        }

        right_split->num_children_ = cur_node->num_children_;
        right_split->children_ =
            new (pointer_allocator().allocate(right_split->num_children_))
                AlexNode<T, P>*[right_split->num_children_];
        right_split->model_.a_ = cur_node->model_.a_ * 2;
        right_split->model_.b_ =
            (cur_node->model_.b_ - cur_node->num_children_ / 2) * 2;
        int cur = cur_node->num_children_ / 2;
        while (cur < cur_node->num_children_) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          int right_child_idx = cur - cur_node->num_children_ / 2;
          for (int i = 2 * right_child_idx;
               i < 2 * (right_child_idx + cur_child_repeats); i++) {
            right_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_);

        int new_bucketID =
            (path_node.bucketID - cur_node->num_children_ / 2) * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          right_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          right_split->children_[i] = prev_right_split;
        }
        next_right_split = right_split;
      }
      assert(next_left_split != nullptr && next_right_split != nullptr);
      if (verbose) {
        std::cout << "[Splitting upwards through-node] level "
                  << cur_node->level_ << ", node addr: " << path_node.node
                  << ", node children: " << path_node.node->num_children_
                  << ", child index: " << path_node.bucketID
                  << ", child repeats in node: "
                  << (1 << prev_left_split->duplication_factor_)
                  << ", node repeats in parent: "
                  << (1 << path_node.node->duplication_factor_)
                  << ", new nodes addr: " << left_split << "," << right_split
                  << std::endl;
      }
      to_delete.push_back(cur_node);
      if (!pull_up_left_child && !pull_up_right_child) {
        stats_.num_model_nodes++;
      }
      // This is the expected duplication factor; it will be correct once we
      // split/expand the parent
      next_left_split->duplication_factor_ = cur_node->duplication_factor_;
      next_right_split->duplication_factor_ = cur_node->duplication_factor_;
      prev_left_split = next_left_split;
      prev_right_split = next_right_split;
      path_idx--;
    }

    // Insert into the top node
    const TraversalNode& top_path_node = traversal_path[path_idx];
    model_node_type* top_node = top_path_node.node;
    assert(top_node->level_ == stop_propagation_level);
    if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
      *new_parent = top_node;
    }
    int top_bucketID = top_path_node.bucketID;
    int repeats =
        1 << prev_left_split->duplication_factor_;  // this was the duplication
                                                    // factor of the child that
                                                    // was deleted
    if (verbose) {
      std::cout << "[Splitting upwards top node] level "
                << stop_propagation_level << ", node addr: " << top_node
                << ", node children: " << top_node->num_children_
                << ", child index: " << top_bucketID
                << ", child repeats in node: " << repeats
                << ", node repeats in parent: "
                << (1 << top_node->duplication_factor_) << std::endl;
    }

    // Expand the top node if necessary
    if (repeats == 1) {
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += top_node->num_children_;
      top_node->expand(1);  // double size of top node
      top_bucketID *= 2;
      repeats *= 2;
    } else {
      prev_left_split->duplication_factor_--;
      prev_right_split->duplication_factor_--;
    }

    int start_bucketID =
        top_bucketID -
        (top_bucketID % repeats);  // first bucket with same child
    int mid_bucketID = start_bucketID + repeats / 2;
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with next child
    for (int i = start_bucketID; i < mid_bucketID; i++) {
      top_node->children_[i] = prev_left_split;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      top_node->children_[i] = prev_right_split;
    }

    for (auto node : to_delete) {
      delete_node(node);
    }

    return new_data_node;
  }